

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_string<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  char_type_conflict cVar2;
  byte bVar3;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  context<toml::type_config> *in_stack_00000050;
  location *in_stack_00000058;
  context<toml::type_config> *in_stack_00000130;
  location *in_stack_00000138;
  source_location src;
  context<toml::type_config> *in_stack_00000300;
  location *in_stack_00000308;
  location first;
  source_location *in_stack_fffffffffffffbd8;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  location *in_stack_fffffffffffffc00;
  allocator<char> *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc18;
  char_type_conflict in_stack_fffffffffffffc1f;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *this;
  allocator<char> local_3c9;
  error_info *in_stack_fffffffffffffc38;
  location *in_stack_fffffffffffffc48;
  region *in_stack_fffffffffffffc50;
  region *in_stack_fffffffffffffc58;
  source_location *in_stack_fffffffffffffc60;
  allocator<char> local_329 [193];
  string *in_stack_fffffffffffffd98;
  source_location *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffda8;
  
  this = in_RDI;
  location::location(in_stack_fffffffffffffc00,
                     (location *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
  bVar1 = location::eof((location *)in_stack_fffffffffffffbe0);
  if (!bVar1) {
    in_stack_fffffffffffffc1f = location::current((location *)in_stack_fffffffffffffbd8);
    if (in_stack_fffffffffffffc1f == '\"') {
      literal::literal<4ul>((literal *)in_stack_fffffffffffffbe0,&in_stack_fffffffffffffbd8->is_ok_)
      ;
      literal::scan((literal *)in_stack_fffffffffffffc58,(location *)in_stack_fffffffffffffc50);
      bVar1 = region::is_ok((region *)0x66734b);
      region::~region((region *)in_stack_fffffffffffffbe0);
      literal::~literal((literal *)0x667369);
      if (bVar1) {
        location::operator=((location *)in_stack_fffffffffffffbe0,
                            (location *)in_stack_fffffffffffffbd8);
        parse_ml_basic_string<toml::type_config>(in_stack_00000308,in_stack_00000300);
      }
      else {
        location::operator=((location *)in_stack_fffffffffffffbe0,
                            (location *)in_stack_fffffffffffffbd8);
        parse_basic_string<toml::type_config>(in_stack_00000058,in_stack_00000050);
      }
      goto LAB_006677d1;
    }
  }
  bVar1 = location::eof((location *)in_stack_fffffffffffffbe0);
  if (!bVar1) {
    cVar2 = location::current((location *)in_stack_fffffffffffffbd8);
    if (cVar2 == '\'') {
      literal::literal<4ul>((literal *)in_stack_fffffffffffffbe0,&in_stack_fffffffffffffbd8->is_ok_)
      ;
      literal::scan((literal *)in_stack_fffffffffffffc58,(location *)in_stack_fffffffffffffc50);
      bVar3 = region::is_ok((region *)0x6674b5);
      region::~region((region *)in_stack_fffffffffffffbe0);
      literal::~literal((literal *)0x6674d3);
      if ((bVar3 & 1) == 0) {
        location::operator=((location *)in_stack_fffffffffffffbe0,
                            (location *)in_stack_fffffffffffffbd8);
        parse_literal_string<toml::type_config>(in_stack_00000058,in_stack_00000050);
      }
      else {
        location::operator=((location *)in_stack_fffffffffffffbe0,
                            (location *)in_stack_fffffffffffffbd8);
        parse_ml_literal_string<toml::type_config>(in_stack_00000138,in_stack_00000130);
      }
      goto LAB_006677d1;
    }
  }
  region::region(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  source_location::source_location(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  region::~region((region *)in_stack_fffffffffffffbe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
             in_stack_fffffffffffffc10);
  source_location::source_location
            ((source_location *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
             in_stack_fffffffffffffc10);
  make_error_info<>(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  in_stack_fffffffffffffbe0 =
       (result<toml::basic_value<toml::type_config>,_toml::error_info> *)(local_329 + 0x79);
  err<toml::error_info>(in_stack_fffffffffffffc38);
  result<toml::basic_value<toml::type_config>,_toml::error_info>::result
            (in_stack_fffffffffffffbe0,(failure_type *)in_stack_fffffffffffffbd8);
  failure<toml::error_info>::~failure((failure<toml::error_info> *)0x667689);
  error_info::~error_info((error_info *)in_stack_fffffffffffffbe0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbe0);
  std::allocator<char>::~allocator(&local_3c9);
  source_location::~source_location((source_location *)in_stack_fffffffffffffbe0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbe0);
  std::allocator<char>::~allocator(local_329);
  source_location::~source_location((source_location *)in_stack_fffffffffffffbe0);
LAB_006677d1:
  location::~location((location *)in_stack_fffffffffffffbe0);
  return in_RDI;
}

Assistant:

result<basic_value<TC>, error_info>
parse_string(location& loc, const context<TC>& ctx)
{
    const auto first = loc;

    if( ! loc.eof() && loc.current() == '"')
    {
        if(literal("\"\"\"").scan(loc).is_ok())
        {
            loc = first;
            return parse_ml_basic_string(loc, ctx);
        }
        else
        {
            loc = first;
            return parse_basic_string(loc, ctx);
        }
    }
    else if( ! loc.eof() && loc.current() == '\'')
    {
        if(literal("'''").scan(loc).is_ok())
        {
            loc = first;
            return parse_ml_literal_string(loc, ctx);
        }
        else
        {
            loc = first;
            return parse_literal_string(loc, ctx);
        }
    }
    else
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_string: "
            "not a string", std::move(src), "here"));
    }
}